

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void load_panel(void)

{
  Fl_Widget_Type *pFVar1;
  int iVar2;
  Fl_Type **ppFVar3;
  
  if (the_panel == (Fl_Window *)0x0) {
    return;
  }
  numselected = 0;
  current_widget = (Fl_Widget_Type *)0x0;
  if (Fl_Type::current != (Fl_Type *)0x0) {
    iVar2 = (*Fl_Type::current->_vptr_Fl_Type[0x17])(Fl_Type::current);
    if (iVar2 != 0) {
      current_widget = (Fl_Widget_Type *)Fl_Type::current;
    }
    ppFVar3 = &Fl_Type::first;
    while (pFVar1 = (Fl_Widget_Type *)*ppFVar3, pFVar1 != (Fl_Widget_Type *)0x0) {
      iVar2 = (*(pFVar1->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar1);
      if (((iVar2 != 0) && ((pFVar1->super_Fl_Type).selected != '\0')) &&
         (numselected = numselected + 1, current_widget == (Fl_Widget_Type *)0x0)) {
        current_widget = pFVar1;
      }
      ppFVar3 = &(pFVar1->super_Fl_Type).next;
    }
    if (numselected != 0) {
      propagate_load(&the_panel->super_Fl_Group,"LOAD");
      return;
    }
  }
  (*(the_panel->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])();
  return;
}

Assistant:

static void load_panel() {
  if (!the_panel) return;

  // find all the Fl_Widget subclasses currently selected:
  numselected = 0;
  current_widget = 0;
  if (Fl_Type::current) {
    if (Fl_Type::current->is_widget())
      current_widget=(Fl_Widget_Type*)Fl_Type::current;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->is_widget() && o->selected) {
	numselected++;
	if (!current_widget) current_widget = (Fl_Widget_Type*)o;
      }
    }
  }
  if (numselected)
    propagate_load(the_panel, LOAD);
  else
    the_panel->hide();
}